

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_decimal.hpp
# Opt level: O1

duckdb_decimal * __thiscall
duckdb::TryCastToDecimalCInternal<double,duckdb::ToCDecimalCastWrapper<long>>
          (duckdb_decimal *__return_storage_ptr__,duckdb *this,double source,uint8_t width,
          uint8_t scale)

{
  bool bVar1;
  duckdb_decimal result;
  CastParameters parameters;
  duckdb_decimal local_58;
  CastParameters local_40;
  
  local_40.cast_data.ptr = (BoundCastData *)0x0;
  local_40.strict = false;
  local_40.error_message = (string *)0x0;
  local_40.local_state.ptr = (FunctionLocalState *)0x0;
  local_40.query_location.index = 0xffffffffffffffff;
  local_40.nullify_parent = false;
  bVar1 = ToCDecimalCastWrapper<long>::Operation<double>
                    (source,&local_58,&local_40,(uint8_t)this,width);
  if ((!bVar1) && (FetchDefaultValue::Operation<duckdb_decimal>(), !bVar1)) {
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->value).upper = local_58.value.upper;
  __return_storage_ptr__->width = local_58.width;
  __return_storage_ptr__->scale = local_58.scale;
  *(undefined6 *)&__return_storage_ptr__->field_0x2 = local_58._2_6_;
  (__return_storage_ptr__->value).lower = local_58.value.lower;
  return __return_storage_ptr__;
}

Assistant:

duckdb_decimal TryCastToDecimalCInternal(SOURCE_TYPE source, uint8_t width, uint8_t scale) {
	duckdb_decimal result;
	try {
		CastParameters parameters;
		if (!OP::template Operation<SOURCE_TYPE>(source, result, parameters, width, scale)) {
			return FetchDefaultValue::Operation<duckdb_decimal>();
		}
	} catch (...) {
		return FetchDefaultValue::Operation<duckdb_decimal>();
	}
	return result;
}